

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O2

string * __thiscall
helics::RandomDropFilterOperation::getString_abi_cxx11_
          (string *__return_storage_ptr__,RandomDropFilterOperation *this,string_view property)

{
  bool bVar1;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  
  __y._M_str = "dropprob";
  __y._M_len = 8;
  bVar1 = std::operator==(property,__y);
  if ((!bVar1) &&
     (__y_00._M_str = "prob", __y_00._M_len = 4, bVar1 = std::operator==(property,__y_00), !bVar1))
  {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  std::__cxx11::to_string
            (__return_storage_ptr__,(this->dropProb).super___atomic_float<double>._M_fp);
  return __return_storage_ptr__;
}

Assistant:

std::string RandomDropFilterOperation::getString(std::string_view property)
{
    if ((property == "dropprob") || (property == "prob")) {
        return std::to_string(dropProb.load());
    }
    return FilterOperations::getString(property);
}